

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_expr_select(lyxp_expr *exp,uint16_t *exp_idx,lyxp_expr_type etype,lyd_node *cur_node,
                    lys_module *param_5,lyxp_set *set,int options)

{
  bool bVar1;
  ly_ctx *local_58;
  lyxp_expr_type local_44;
  uint16_t local_40;
  ushort local_3e;
  lyxp_expr_type next_etype;
  uint16_t count;
  uint16_t i;
  int ret;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  lyxp_expr_type etype_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  if (exp->repeat[*exp_idx] == (lyxp_expr_type *)0x0) {
    local_44 = LYXP_EXPR_NONE;
  }
  else {
    for (local_3e = 0; etype < exp->repeat[*exp_idx][local_3e]; local_3e = local_3e + 1) {
    }
    if (local_3e == 0) {
      local_44 = LYXP_EXPR_NONE;
    }
    else {
      local_44 = exp->repeat[*exp_idx][(int)(local_3e - 1)];
      local_40 = 0;
      while( true ) {
        bVar1 = false;
        if (local_3e != 0) {
          bVar1 = exp->repeat[*exp_idx][(int)(local_3e - 1)] == local_44;
        }
        if (!bVar1) break;
        local_40 = local_40 + 1;
        local_3e = local_3e - 1;
      }
    }
  }
  switch(local_44) {
  case LYXP_EXPR_NONE:
    next_etype = eval_path_expr(exp,exp_idx,cur_node,param_5,set,options);
    break;
  case LYXP_EXPR_OR:
    next_etype = eval_or_expr(exp,exp_idx,local_40,cur_node,param_5,set,options);
    break;
  case LYXP_EXPR_AND:
    next_etype = eval_and_expr(exp,exp_idx,local_40,cur_node,param_5,set,options);
    break;
  case LYXP_EXPR_EQUALITY:
    next_etype = eval_equality_expr(exp,exp_idx,local_40,cur_node,param_5,set,options);
    break;
  case LYXP_EXPR_RELATIONAL:
    next_etype = eval_relational_expr(exp,exp_idx,local_40,cur_node,param_5,set,options);
    break;
  case LYXP_EXPR_ADDITIVE:
    next_etype = eval_additive_expr(exp,exp_idx,local_40,cur_node,param_5,set,options);
    break;
  case LYXP_EXPR_MULTIPLICATIVE:
    next_etype = eval_multiplicative_expr(exp,exp_idx,local_40,cur_node,param_5,set,options);
    break;
  case LYXP_EXPR_UNARY:
    next_etype = eval_unary_expr(exp,exp_idx,local_40,cur_node,param_5,set,options);
    break;
  case LYXP_EXPR_UNION:
    next_etype = eval_union_expr(exp,exp_idx,local_40,cur_node,param_5,set,options);
    break;
  default:
    next_etype = ~LYXP_EXPR_NONE;
    if (param_5 == (lys_module *)0x0) {
      local_58 = (ly_ctx *)0x0;
    }
    else {
      local_58 = param_5->ctx;
    }
    ly_log(local_58,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
           ,0x20eb);
  }
  return next_etype;
}

Assistant:

static int
eval_expr_select(struct lyxp_expr *exp, uint16_t *exp_idx, enum lyxp_expr_type etype, struct lyd_node *cur_node,
                 struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    int ret;
    uint16_t i, count;
    enum lyxp_expr_type next_etype;

    /* process operator repeats */
    if (!exp->repeat[*exp_idx]) {
        next_etype = LYXP_EXPR_NONE;
    } else {
        /* find etype repeat */
        for (i = 0; exp->repeat[*exp_idx][i] > etype; ++i);

        /* select one-priority lower because etype expression called us */
        if (i) {
            next_etype = exp->repeat[*exp_idx][i - 1];
            /* count repeats for that expression */
            for (count = 0; i && exp->repeat[*exp_idx][i - 1] == next_etype; ++count, --i);
        } else {
            next_etype = LYXP_EXPR_NONE;
        }
    }

    /* decide what expression are we parsing based on the repeat */
    switch (next_etype) {
    case LYXP_EXPR_OR:
        ret = eval_or_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_AND:
        ret = eval_and_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_EQUALITY:
        ret = eval_equality_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_RELATIONAL:
        ret = eval_relational_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_ADDITIVE:
        ret = eval_additive_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_MULTIPLICATIVE:
        ret = eval_multiplicative_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_UNARY:
        ret = eval_unary_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_UNION:
        ret = eval_union_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_NONE:
        ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, set, options);
        break;
    default:
        ret = -1;
        LOGINT(local_mod ? local_mod->ctx : NULL);
        break;
    }

    return ret;
}